

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

container_t * container_add(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  ulong uVar1;
  uint8_t uVar2;
  uint uVar3;
  array_container_t *ac;
  ulong uVar4;
  int lenarray;
  uint8_t typecode_local;
  ulong local_38;
  
  typecode_local = typecode;
  ac = (array_container_t *)get_writable_copy_if_shared(c,&typecode_local);
  if (typecode_local == '\x03') {
    run_container_add((run_container_t *)ac,val);
    uVar2 = '\x03';
    goto LAB_0011c8b9;
  }
  if (typecode_local == '\x02') {
    lenarray = ac->cardinality;
    if (((long)lenarray == 0) || ((lenarray < 0x1000 && (ac->array[(long)lenarray + -1] < val)))) {
      if (lenarray == ac->capacity) {
        array_container_grow(ac,lenarray + 1,true);
        lenarray = ac->cardinality;
      }
      ac->cardinality = lenarray + 1;
      ac->array[lenarray] = val;
    }
    else {
      local_38 = (ulong)val;
      uVar3 = binarySearch(ac->array,lenarray,val);
      if (-1 < (int)uVar3 || 0xfff < lenarray) {
        uVar2 = '\x02';
        if (-1 < (int)uVar3) goto LAB_0011c8b9;
        ac = (array_container_t *)bitset_container_from_array(ac);
        uVar1 = *(ulong *)(ac->array + (local_38 >> 6) * 4);
        uVar4 = uVar1 | 1L << ((ulong)val & 0x3f);
        ac->cardinality = ac->cardinality + (int)((uVar1 ^ uVar4) >> ((byte)val & 0x3f));
        *(ulong *)(ac->array + (local_38 >> 6) * 4) = uVar4;
        goto LAB_0011c8b7;
      }
      if (ac->cardinality == ac->capacity) {
        array_container_grow(ac,ac->cardinality + 1,true);
      }
      uVar3 = ~uVar3;
      memmove(ac->array + (ulong)uVar3 + 1,ac->array + uVar3,(long)(int)(lenarray - uVar3) * 2);
      ac->array[uVar3] = val;
      ac->cardinality = ac->cardinality + 1;
    }
    uVar2 = '\x02';
  }
  else {
    uVar1 = *(ulong *)(ac->array + (ulong)(val >> 6) * 4);
    uVar4 = uVar1 | 1L << ((ulong)val & 0x3f);
    ac->cardinality = ac->cardinality + (int)((uVar1 ^ uVar4) >> ((byte)val & 0x3f));
    *(ulong *)(ac->array + (ulong)(val >> 6) * 4) = uVar4;
LAB_0011c8b7:
    uVar2 = '\x01';
  }
LAB_0011c8b9:
  *new_typecode = uVar2;
  return ac;
}

Assistant:

static inline container_t *container_add(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode) {
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_set(CAST_bitset(c), val);
            *new_typecode = BITSET_CONTAINER_TYPE;
            return c;
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *ac = CAST_array(c);
            if (array_container_try_add(ac, val, DEFAULT_MAX_SIZE) != -1) {
                *new_typecode = ARRAY_CONTAINER_TYPE;
                return ac;
            } else {
                bitset_container_t *bitset = bitset_container_from_array(ac);
                bitset_container_add(bitset, val);
                *new_typecode = BITSET_CONTAINER_TYPE;
                return bitset;
            }
        } break;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_add(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}